

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

bool_t prf_model_save(prf_model_t *model,bfile_t *bfile)

{
  prf_cb_t callback;
  _func_int_void_ptr_void_ptr *in_RSI;
  prf_cb_t saveCB;
  
  callback.data = in_RSI;
  callback.func = in_RSI;
  prf_model_traverse_io((prf_model_t *)save_cb,callback);
  return 1;
}

Assistant:

bool_t
prf_model_save(
    prf_model_t * model,
    bfile_t * bfile )
{
    prf_cb_t saveCB;

    assert( model != NULL );
    assert( model->header != NULL );
    assert( bfile != NULL );
    assert( bf_is_writable( bfile ) == TRUE );

    prf_cb_set( saveCB, save_cb, bfile );
    prf_model_traverse_io( model, saveCB );

    return TRUE;
}